

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O0

char * duckdb::Highlighting::GetColorOption(char *option)

{
  int iVar1;
  char *in_RDI;
  size_t index;
  long local_18;
  
  local_18 = 0;
  while( true ) {
    if (*(long *)(terminal_colors + local_18 * 0x10) == 0) {
      return (char *)0x0;
    }
    iVar1 = strcmp(*(char **)(terminal_colors + local_18 * 0x10),in_RDI);
    if (iVar1 == 0) break;
    local_18 = local_18 + 1;
  }
  return *(char **)(terminal_colors + local_18 * 0x10 + 8);
}

Assistant:

const char *Highlighting::GetColorOption(const char *option) {
	size_t index = 0;
	while (terminal_colors[index].color_name) {
		if (strcmp(terminal_colors[index].color_name, option) == 0) {
			return terminal_colors[index].highlight;
		}
		index++;
	}
	return nullptr;
}